

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O3

TPZTransform<double> *
pzshape::TPZShapeQuad::ParametricTransform
          (TPZTransform<double> *__return_storage_ptr__,int trans_id)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,2,2);
  lVar3 = (long)trans_id * 0x20;
  lVar1 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  if ((lVar1 < 1) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem;
  *pdVar2 = *(double *)(gTrans2dQ + lVar3);
  if ((lVar1 < 1) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2[lVar1] = *(double *)(gTrans2dQ + lVar3 + 8);
  if ((lVar1 < 2) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2[1] = *(double *)(gTrans2dQ + lVar3 + 0x10);
  if ((1 < lVar1) &&
     (1 < (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fCol)) {
    pdVar2[lVar1 + 1] = *(double *)(gTrans2dQ + lVar3 + 0x18);
    return __return_storage_ptr__;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

TPZTransform<REAL> TPZShapeQuad::ParametricTransform(int trans_id){
        TPZTransform<REAL> trans(2,2);
        trans.Mult()(0,0) = gTrans2dQ[trans_id][0][0];
        trans.Mult()(0,1) = gTrans2dQ[trans_id][0][1];
        trans.Mult()(1,0) = gTrans2dQ[trans_id][1][0];
        trans.Mult()(1,1) = gTrans2dQ[trans_id][1][1];
        return trans;
    }